

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O3

int get_line(FILE *f,char *hash,char *filename,int verbose,int *size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  char *__s;
  
  iVar2 = feof((FILE *)f);
  if (iVar2 == 0) {
    iVar2 = (int)filename;
    do {
      pcVar4 = fgets(filename,0x1000,(FILE *)f);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      pcVar4 = filename + -2;
      lVar6 = 0;
      do {
        lVar11 = lVar6;
        pcVar4 = pcVar4 + 1;
        lVar6 = lVar11 + 1;
      } while (filename[lVar11] == ' ');
      __s = filename + lVar11;
      sVar5 = strlen(__s);
      lVar6 = (long)(int)sVar5;
      for (lVar7 = 0; (pcVar4[lVar7 + lVar6] == '\r' || (pcVar4[lVar7 + lVar6] == '\n'));
          lVar7 = lVar7 + -1) {
        pcVar4[lVar7 + lVar6] = '\0';
      }
      if (((1 - lVar6 != lVar7) && (pcVar4 = strchr(__s,0x20), pcVar4 != (char *)0x0)) &&
         (pcVar4[1] != '\0')) {
        iVar9 = (int)pcVar4;
        iVar10 = (int)(lVar11 + 1);
        iVar3 = ((1 - iVar2) + iVar9) - iVar10;
        *size = iVar3;
        if (iVar3 < 1) {
LAB_00101937:
          iVar3 = (iVar9 - iVar2) - iVar10;
          if ((iVar3 == 0x3f) || (iVar3 == 0x7f)) {
            memcpy(hash,__s,(ulong)(((iVar9 - iVar2) - iVar10) + 1));
            hash[*size] = '\0';
          }
          else {
LAB_00101972:
            *size = 0;
            memset(hash,0,0x81);
          }
          sVar5 = strlen(pcVar4);
          memmove(filename,pcVar4 + 1,sVar5);
          *size = *size / 2;
          return 1;
        }
        uVar8 = 0;
        while (((bVar1 = filename[uVar8 + lVar11], '/' < (char)bVar1 && (6 < (byte)(bVar1 - 0x3a)))
               && ((bVar1 < 0x67 && (0x19 < (byte)(bVar1 + 0xb9)))))) {
          uVar8 = uVar8 + 1;
          if ((((1 - iVar2) + iVar9) - iVar10 & 0x7fffffff) <= uVar8) {
            if (((iVar9 - iVar2) - iVar10) + 1 < 0x81) goto LAB_00101937;
            goto LAB_00101972;
          }
        }
      }
      if (verbose != 0) {
        printf("Skipping line %s\n",filename);
      }
      iVar3 = feof((FILE *)f);
    } while (iVar3 == 0);
  }
  return 0;
}

Assistant:

int get_line(FILE *f, char *hash, char *filename, int verbose, int *size)
{
    int i, len;
    char *ptr = filename;
    char *spacepos = NULL;

    while (!feof(f)) {
        if (!fgets(filename, PATH_MAX, f))
            return 0;
        ptr = filename;
        while (*ptr == ' ')
            ptr++;

        len = strlen(ptr);
        while (ptr[--len] == '\n' || ptr[len] == '\r')
            ptr[len] = 0;

        if (len == 0)
            goto nextline;

        spacepos = strchr(ptr, ' ');
        if (spacepos == NULL || strlen(spacepos + 1) == 0)
            goto nextline;

        *size = spacepos - ptr;

        for (i = 0; i < *size; i++) {
            if (ptr[i] < '0' || (ptr[i] > '9' && ptr[i] < 'A') ||
                (ptr[i] > 'F' && ptr[i] < 'a') || ptr[i] > 'f') {
                goto nextline;
            }
        }

        if (*size > 128 || ((*size != 64) && (*size != 128))) {
            *size = 0;
            memset(hash, 0, MAX_HASH_TXT_BYTES + 1);
        } else {
            memcpy(hash, ptr, *size);
            hash[*size] = 0;
        }
        memmove(filename, spacepos + 1, strlen(spacepos));

        *size /= 2;
        return 1;
 nextline:
        if (verbose)
            printf("Skipping line %s\n", filename);
    }
    return 0;
}